

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

_Bool ssh2_common_filter_queue(PacketProtocolLayer *ppl)

{
  Ssh *ssh;
  LogContext *ctx;
  _Bool _Var1;
  uint uVar2;
  PktIn *pPVar3;
  char *event;
  unsigned_long uVar4;
  bool bVar5;
  ptrlen pVar6;
  char *local_b0;
  undefined1 local_90 [8];
  ptrlen algname;
  ptrlen extvalue;
  ptrlen extname;
  uint32_t i;
  uint32_t nexts;
  size_t local_50;
  void *local_48;
  size_t local_40;
  int reason;
  ptrlen msg;
  PktIn *pktin;
  PacketProtocolLayer *ppl_local;
  
  while (pPVar3 = (*ppl->in_pq->after)(&ppl->in_pq->pqb,(PacketQueueNode *)ppl->in_pq,false),
        pPVar3 != (PktIn *)0x0) {
    switch(pPVar3->type) {
    case 1:
      uVar4 = BinarySource_get_uint32(pPVar3->binarysource_);
      uVar2 = (uint)uVar4;
      pVar6 = BinarySource_get_string(pPVar3->binarysource_);
      local_48 = pVar6.ptr;
      local_40 = pVar6.len;
      ssh = ppl->ssh;
      if (((int)uVar2 < 1) || (0xf < uVar2)) {
        local_b0 = "unknown";
      }
      else {
        local_b0 = ssh2_common_filter_queue::ssh2_disconnect_reasons[(int)uVar2];
      }
      uVar2 = string_length_for_printf(local_40);
      ssh_remote_error(ssh,"Remote side sent disconnect message\ntype %d (%s):\n\"%.*s\"",
                       uVar4 & 0xffffffff,local_b0,(ulong)uVar2,local_48);
      return true;
    case 2:
      (*ppl->in_pq->after)(&ppl->in_pq->pqb,(PacketQueueNode *)ppl->in_pq,true);
      break;
    default:
      return false;
    case 4:
      BinarySource_get_bool(pPVar3->binarysource_);
      pVar6 = BinarySource_get_string(pPVar3->binarysource_);
      _i = pVar6.ptr;
      local_50 = pVar6.len;
      ctx = ppl->logctx;
      uVar2 = string_length_for_printf(local_50);
      event = dupprintf("Remote debug message: %.*s",(ulong)uVar2,_i);
      logevent_and_free(ctx,event);
      (*ppl->in_pq->after)(&ppl->in_pq->pqb,(PacketQueueNode *)ppl->in_pq,true);
      break;
    case 7:
      uVar4 = BinarySource_get_uint32(pPVar3->binarysource_);
      extname.len._0_4_ = 0;
      while( true ) {
        bVar5 = false;
        if ((uint)extname.len < (uint)uVar4) {
          bVar5 = pPVar3->binarysource_[0].err == BSE_NO_ERROR;
        }
        if (!bVar5) break;
        pVar6 = BinarySource_get_string(pPVar3->binarysource_);
        join_0x00000010_0x00000000_ = BinarySource_get_string(pPVar3->binarysource_);
        _Var1 = ptrlen_eq_string(pVar6,"server-sig-algs");
        if (_Var1) {
          while (_Var1 = get_commasep_word((ptrlen *)&algname.len,(ptrlen *)local_90), _Var1) {
            _Var1 = ptrlen_eq_string(_local_90,"rsa-sha2-256");
            if (_Var1) {
              ppl->bpp->ext_info_rsa_sha256_ok = true;
            }
            _Var1 = ptrlen_eq_string(_local_90,"rsa-sha2-512");
            if (_Var1) {
              ppl->bpp->ext_info_rsa_sha512_ok = true;
            }
          }
        }
        extname.len._0_4_ = (uint)extname.len + 1;
      }
      (*ppl->in_pq->after)(&ppl->in_pq->pqb,(PacketQueueNode *)ppl->in_pq,true);
    }
  }
  return false;
}

Assistant:

bool ssh2_common_filter_queue(PacketProtocolLayer *ppl)
{
    static const char *const ssh2_disconnect_reasons[] = {
        NULL,
        "host not allowed to connect",
        "protocol error",
        "key exchange failed",
        "host authentication failed",
        "MAC error",
        "compression error",
        "service not available",
        "protocol version not supported",
        "host key not verifiable",
        "connection lost",
        "by application",
        "too many connections",
        "auth cancelled by user",
        "no more auth methods available",
        "illegal user name",
    };

    PktIn *pktin;
    ptrlen msg;
    int reason;

    while ((pktin = pq_peek(ppl->in_pq)) != NULL) {
        switch (pktin->type) {
          case SSH2_MSG_DISCONNECT:
            reason = get_uint32(pktin);
            msg = get_string(pktin);

            ssh_remote_error(
                ppl->ssh, "Remote side sent disconnect message\n"
                "type %d (%s):\n\"%.*s\"", reason,
                ((reason > 0 && reason < lenof(ssh2_disconnect_reasons)) ?
                 ssh2_disconnect_reasons[reason] : "unknown"),
                PTRLEN_PRINTF(msg));
            /* don't try to pop the queue, because we've been freed! */
            return true;               /* indicate that we've been freed */

          case SSH2_MSG_DEBUG:
            /* XXX maybe we should actually take notice of the return value */
            get_bool(pktin);
            msg = get_string(pktin);
            ppl_logevent("Remote debug message: %.*s", PTRLEN_PRINTF(msg));
            pq_pop(ppl->in_pq);
            break;

          case SSH2_MSG_IGNORE:
            /* Do nothing, because we're ignoring it! Duhh. */
            pq_pop(ppl->in_pq);
            break;

          case SSH2_MSG_EXT_INFO: {
            /*
             * The BPP enforces that these turn up only at legal
             * points in the protocol. In particular, it will not pass
             * an EXT_INFO on to us if it arrives before encryption is
             * enabled (which is when a MITM could inject one
             * maliciously).
             *
             * However, one of the criteria for legality is that a
             * server is permitted to send this message immediately
             * _before_ USERAUTH_SUCCESS. So we may receive this
             * message not yet knowing whether it's legal to have sent
             * it - we won't know until the BPP processes the next
             * packet.
             *
             * But that should be OK, because firstly, an
             * out-of-sequence EXT_INFO that's still within the
             * encrypted session is only a _protocol_ violation, not
             * an attack; secondly, any data we set in response to
             * such an illegal EXT_INFO won't have a chance to affect
             * the session before the BPP aborts it anyway.
             */
            uint32_t nexts = get_uint32(pktin);
            for (uint32_t i = 0; i < nexts && !get_err(pktin); i++) {
                ptrlen extname = get_string(pktin);
                ptrlen extvalue = get_string(pktin);
                if (ptrlen_eq_string(extname, "server-sig-algs")) {
                    /*
                     * Server has sent a list of signature algorithms
                     * it will potentially accept for user
                     * authentication keys. Check in particular
                     * whether the RFC 8332 improved versions of
                     * ssh-rsa are in the list, and set flags in the
                     * BPP if so.
                     *
                     * TODO: another thing we _could_ do here is to
                     * record a full list of the algorithm identifiers
                     * we've seen, whether we understand them
                     * ourselves or not. Then we could use that as a
                     * pre-filter during userauth, to skip keys in the
                     * SSH agent if we already know the server can't
                     * possibly accept them. (Even if the key
                     * algorithm is one that the agent and the server
                     * both understand but we do not.)
                     */
                    ptrlen algname;
                    while (get_commasep_word(&extvalue, &algname)) {
                        if (ptrlen_eq_string(algname, "rsa-sha2-256"))
                            ppl->bpp->ext_info_rsa_sha256_ok = true;
                        if (ptrlen_eq_string(algname, "rsa-sha2-512"))
                            ppl->bpp->ext_info_rsa_sha512_ok = true;
                    }
                }
            }
            pq_pop(ppl->in_pq);
            break;
          }

          default:
            return false;
        }
    }

    return false;
}